

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

BrotliDecoderErrorCode
ReadHuffmanCode(uint32_t alphabet_size_max,uint32_t alphabet_size_limit,HuffmanCode *table,
               uint32_t *opt_table_size,BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  uint16_t *count;
  uint8_t *code_lengths;
  uint16_t *puVar1;
  short *psVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  byte *pbVar6;
  uint *puVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  uint32_t uVar12;
  long lVar13;
  sbyte sVar14;
  BrotliRunningHuffmanState BVar15;
  uint32_t uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint64_t uVar25;
  size_t sVar26;
  uint32_t uVar27;
  uint16_t *puVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uint local_54;
  
  br = &s->br;
  count = (s->arena).header.code_length_histo;
  code_lengths = (s->arena).header.code_length_code_lengths;
  BVar15 = (s->arena).header.substate_huffman;
  while (BVar15 == BROTLI_STATE_HUFFMAN_NONE) {
    uVar16 = (s->br).bit_pos_;
    if (uVar16 - 0x3f < 2) {
      sVar26 = (s->br).avail_in;
      if (sVar26 == 0) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar19 = (s->br).val_;
      pbVar6 = (s->br).next_in;
      (s->br).val_ = uVar19 >> 8;
      uVar19 = (ulong)*pbVar6 << 0x38 | uVar19 >> 8;
      (s->br).val_ = uVar19;
      uVar16 = uVar16 - 8;
      (s->br).avail_in = sVar26 - 1;
      (s->br).next_in = pbVar6 + 1;
    }
    else {
      uVar19 = br->val_;
    }
    uVar18 = (uint)(uVar19 >> ((byte)uVar16 & 0x3f)) & 3;
    (s->arena).header.sub_loop_counter = uVar18;
    uVar16 = uVar16 + 2;
    (s->br).bit_pos_ = uVar16;
    if (uVar18 == 1) goto LAB_0013fcec;
    *(undefined8 *)((long)&s->arena + 0x1c) = 0x2000000000;
    *(undefined1 (*) [16])((long)&s->arena + 0x6de) = (undefined1  [16])0x0;
    code_lengths[0] = '\0';
    code_lengths[1] = '\0';
    code_lengths[2] = '\0';
    code_lengths[3] = '\0';
    code_lengths[4] = '\0';
    code_lengths[5] = '\0';
    code_lengths[6] = '\0';
    code_lengths[7] = '\0';
    code_lengths[8] = '\0';
    code_lengths[9] = '\0';
    code_lengths[10] = '\0';
    code_lengths[0xb] = '\0';
    code_lengths[0xc] = '\0';
    code_lengths[0xd] = '\0';
    code_lengths[0xe] = '\0';
    code_lengths[0xf] = '\0';
    (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
    BVar15 = BROTLI_STATE_HUFFMAN_COMPLEX;
  }
  switch(BVar15) {
  case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
    uVar16 = (s->br).bit_pos_;
LAB_0013fcec:
    if (uVar16 - 0x3f < 2) {
      sVar26 = (s->br).avail_in;
      if (sVar26 == 0) {
        (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar19 = (s->br).val_;
      pbVar6 = (s->br).next_in;
      (s->br).val_ = uVar19 >> 8;
      uVar19 = (ulong)*pbVar6 << 0x38 | uVar19 >> 8;
      (s->br).val_ = uVar19;
      uVar16 = uVar16 - 8;
      (s->br).avail_in = sVar26 - 1;
      (s->br).next_in = pbVar6 + 1;
    }
    else {
      uVar19 = br->val_;
    }
    uVar18 = (uint)(uVar19 >> ((byte)uVar16 & 0x3f)) & 3;
    (s->arena).header.symbol = uVar18;
    (s->br).bit_pos_ = uVar16 + 2;
    (s->arena).header.sub_loop_counter = 0;
    uVar23 = 0;
    break;
  case BROTLI_STATE_HUFFMAN_SIMPLE_READ:
    uVar23 = (s->arena).header.sub_loop_counter;
    uVar18 = (s->arena).header.symbol;
    break;
  case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD:
    uVar18 = (s->arena).header.symbol;
    goto LAB_0013fd7c;
  case BROTLI_STATE_HUFFMAN_COMPLEX:
    uVar19 = (ulong)(s->arena).header.sub_loop_counter;
    uVar16 = (s->arena).header.repeat;
    uVar27 = (s->arena).header.space;
    if (uVar19 < 0x12) {
      uVar30 = (s->br).bit_pos_;
      do {
        bVar3 = "\x01\x02\x03\x04"[uVar19];
        if (uVar30 - 0x3d < 4) {
          sVar26 = (s->br).avail_in;
          if (sVar26 != 0) {
            uVar17 = (s->br).val_;
            pbVar6 = (s->br).next_in;
            (s->br).val_ = uVar17 >> 8;
            uVar25 = (ulong)*pbVar6 << 0x38 | uVar17 >> 8;
            (s->br).val_ = uVar25;
            uVar30 = uVar30 - 8;
            (s->br).avail_in = sVar26 - 1;
            (s->br).next_in = pbVar6 + 1;
            goto LAB_0013fe6d;
          }
          if (uVar30 - 0x40 == 0) {
            uVar17 = 0;
          }
          else {
            uVar17 = br->val_ >> ((byte)uVar30 & 0x3f);
          }
          uVar18 = (uint)"\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[uVar17];
          if (-(uVar30 - 0x40) < uVar18) {
            (s->arena).header.sub_loop_counter = (uint32_t)uVar19;
            (s->arena).header.repeat = uVar16;
            (s->arena).header.space = uVar27;
            (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
        }
        else {
          uVar25 = br->val_;
LAB_0013fe6d:
          uVar17 = (ulong)((uint)(uVar25 >> ((byte)uVar30 & 0x3f)) & 0xf);
          uVar18 = (uint)"\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[uVar17];
        }
        uVar30 = uVar18 + uVar30;
        bVar4 = ""[uVar17];
        (s->br).bit_pos_ = uVar30;
        *(byte *)((long)&s->arena + (ulong)bVar3 + 0x6d0) = bVar4;
        if ((0x1111UL >> (uVar17 & 0x3f) & 1) == 0) {
          count[bVar4] = count[bVar4] + 1;
          uVar27 = uVar27 - (0x20U >> (bVar4 & 0x1f));
          uVar16 = uVar16 + 1;
          if (uVar27 - 0x21 < 0xffffffe0) break;
        }
        uVar19 = uVar19 + 1;
      } while ((int)uVar19 != 0x12);
    }
    if ((uVar16 != 1) && (uVar27 != 0)) {
      return BROTLI_DECODER_ERROR_FORMAT_CL_SPACE;
    }
    BrotliBuildCodeLengthsHuffmanTable((s->arena).header.table,code_lengths,count);
    *(undefined1 (*) [16])((long)&s->arena + 0x6f2) = (undefined1  [16])0x0;
    count[0] = 0;
    auVar10 = _DAT_00198d90;
    auVar9 = _DAT_00198d80;
    count[1] = 0;
    count[2] = 0;
    count[3] = 0;
    count[4] = 0;
    count[5] = 0;
    count[6] = 0;
    count[7] = 0;
    puVar28 = (s->arena).header.symbol_lists;
    lVar13 = 0;
    do {
      auVar31._8_4_ = (int)lVar13;
      auVar31._0_8_ = lVar13;
      auVar31._12_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar32 = packssdw(auVar31 | auVar10,auVar31 | auVar9);
      *(undefined1 (*) [16])((long)&s->arena + lVar13 * 4 + 0x650) = auVar32;
      puVar1 = puVar28 + SUB168(auVar31 | auVar10,0);
      puVar1[0] = 0xffff;
      puVar1[1] = 0xffff;
      puVar1[2] = 0xffff;
      puVar1[3] = 0xffff;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x10);
    *(undefined8 *)((long)&s->arena + 0x10) = 0x800000000;
    *(undefined8 *)((long)&s->arena + 0x18) = 0;
    (s->arena).header.space = 0x8000;
    (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
    uVar30 = 0x8000;
    local_54 = 8;
    uVar18 = 0;
    uVar27 = 0;
    uVar16 = 0;
    goto LAB_0014011e;
  case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS:
    uVar16 = (s->arena).header.symbol;
    uVar27 = (s->arena).header.repeat;
    uVar30 = (s->arena).header.space;
    uVar18 = (s->arena).header.repeat_code_len;
    local_54 = (s->arena).header.prev_code_len;
    puVar28 = (s->arena).header.symbol_lists;
LAB_0014011e:
    iVar11 = BrotliWarmupBitReader(br);
    if (iVar11 == 0) {
      uVar16 = (s->arena).header.symbol;
      uVar30 = (s->arena).header.space;
LAB_00140362:
      if (uVar16 < alphabet_size_limit) {
        bVar8 = false;
        do {
          if (uVar30 == 0) goto LAB_001405b5;
          if (bVar8) {
            sVar26 = (s->br).avail_in;
            if (sVar26 == 0) {
              return BROTLI_DECODER_NEEDS_MORE_INPUT;
            }
            uVar19 = (s->br).val_;
            (s->br).val_ = uVar19 >> 8;
            pbVar6 = (s->br).next_in;
            (s->br).val_ = (ulong)*pbVar6 << 0x38 | uVar19 >> 8;
            uVar27 = (s->br).bit_pos_ - 8;
            (s->br).bit_pos_ = uVar27;
            (s->br).avail_in = sVar26 - 1;
            (s->br).next_in = pbVar6 + 1;
          }
          else {
            uVar27 = (s->br).bit_pos_;
          }
          uVar18 = 0;
          if (uVar27 - 0x40 != 0) {
            uVar18 = (uint)(br->val_ >> ((byte)uVar27 & 0x3f));
          }
          uVar23 = -(uVar27 - 0x40);
          bVar3 = (byte)s->trivial_literal_contexts[(ulong)(uVar18 & 0x1f) + 0x11];
          bVar8 = true;
          if (bVar3 <= uVar23) {
            uVar5 = *(ushort *)
                     ((long)s->trivial_literal_contexts + (ulong)(uVar18 & 0x1f) * 4 + 0x46);
            if (uVar5 < 0x10) {
              (s->br).bit_pos_ = uVar27 + bVar3;
              (s->arena).header.repeat = 0;
              uVar18 = (uint)uVar5;
              if (uVar18 != 0) {
                uVar19 = (ulong)uVar18;
                (s->arena).header.symbol_lists[*(int *)((long)&s->arena + uVar19 * 4 + 0x650)] =
                     (uint16_t)uVar16;
                *(uint32_t *)((long)&s->arena + uVar19 * 4 + 0x650) = uVar16;
                (s->arena).header.prev_code_len = uVar18;
                uVar30 = uVar30 - (0x8000U >> ((byte)uVar5 & 0x1f));
                (s->arena).header.space = uVar30;
                psVar2 = (short *)((long)&s->arena + uVar19 * 2 + 0x6e2);
                *psVar2 = *psVar2 + 1;
              }
              uVar16 = uVar16 + 1;
              (s->arena).header.symbol = uVar16;
              bVar8 = false;
            }
            else {
              uVar21 = ((uint)uVar5 + (uint)bVar3) - 0xe;
              if (uVar21 <= uVar23) {
                uVar18 = uVar18 >> (bVar3 & 0x1f) & kBitMask[uVar5 - 0xe];
                (s->br).bit_pos_ = uVar21 + uVar27;
                if (uVar5 == 0x10) {
                  uVar23 = (s->arena).header.prev_code_len;
                  sVar14 = 2;
                }
                else {
                  uVar23 = 0;
                  sVar14 = 3;
                }
                if ((s->arena).header.repeat_code_len == uVar23) {
                  uVar27 = (s->arena).header.repeat;
                  if (uVar27 == 0) goto LAB_001404e0;
                  iVar11 = uVar27 - 2 << sVar14;
                }
                else {
                  (s->arena).header.repeat_code_len = uVar23;
LAB_001404e0:
                  iVar11 = 0;
                  uVar27 = 0;
                }
                puVar28 = (s->arena).header.symbol_lists;
                uVar12 = uVar18 + iVar11 + 3;
                (s->arena).header.repeat = uVar12;
                iVar24 = uVar12 - uVar27;
                uVar21 = iVar24 + uVar16;
                if (alphabet_size_limit < uVar21) {
                  (s->arena).header.symbol = alphabet_size_limit;
                  (s->arena).header.space = 0xfffff;
                  return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
                }
                if (uVar23 == 0) {
                  (s->arena).header.symbol = uVar21;
                }
                else {
                  uVar19 = (ulong)uVar23;
                  iVar11 = ((iVar11 + uVar18) - uVar27) + 3;
                  uVar18 = *(uint *)((long)&s->arena + uVar19 * 4 + 0x650);
                  do {
                    uVar22 = uVar16;
                    puVar28[(int)uVar18] = (uint16_t)uVar22;
                    iVar11 = iVar11 + -1;
                    uVar16 = uVar22 + 1;
                    uVar18 = uVar22;
                  } while (iVar11 != 0);
                  (s->arena).header.symbol = uVar21;
                  *(uint *)((long)&s->arena + uVar19 * 4 + 0x650) = uVar22;
                  uVar30 = uVar30 - (iVar24 << (0xfU - (char)uVar23 & 0x1f));
                  (s->arena).header.space = uVar30;
                  psVar2 = (short *)((long)&s->arena + uVar19 * 2 + 0x6e2);
                  *psVar2 = *psVar2 + (short)iVar24;
                }
                bVar8 = false;
                uVar16 = uVar21;
              }
            }
          }
        } while (uVar16 < alphabet_size_limit);
      }
    }
    else {
      if (uVar30 != 0 && uVar16 < alphabet_size_limit) {
        uVar19 = (s->br).avail_in;
        do {
          if (uVar19 < 4) {
            (s->arena).header.symbol = uVar16;
            (s->arena).header.repeat = uVar27;
            (s->arena).header.prev_code_len = local_54;
            (s->arena).header.repeat_code_len = uVar18;
            (s->arena).header.space = uVar30;
            goto LAB_00140362;
          }
          uVar23 = (s->br).bit_pos_;
          uVar17 = (s->br).val_;
          if (0x1f < uVar23) {
            uVar23 = uVar23 ^ 0x20;
            (s->br).bit_pos_ = uVar23;
            puVar7 = (uint *)(s->br).next_in;
            uVar17 = uVar17 >> 0x20 | (ulong)*puVar7 << 0x20;
            (s->br).val_ = uVar17;
            uVar19 = uVar19 - 4;
            (s->br).avail_in = uVar19;
            (s->br).next_in = (uint8_t *)(puVar7 + 1);
          }
          uVar20 = (ulong)((uint)(uVar17 >> ((byte)uVar23 & 0x3f)) & 0x1f);
          uVar12 = (byte)s->trivial_literal_contexts[uVar20 + 0x11] + uVar23;
          (s->br).bit_pos_ = uVar12;
          uVar5 = *(ushort *)((long)s->trivial_literal_contexts + uVar20 * 4 + 0x46);
          if (uVar5 < 0x10) {
            uVar23 = (uint)uVar5;
            if (uVar23 != 0) {
              uVar17 = (ulong)uVar23;
              puVar28[*(int *)((long)&s->arena + uVar17 * 4 + 0x650)] = (uint16_t)uVar16;
              *(uint32_t *)((long)&s->arena + uVar17 * 4 + 0x650) = uVar16;
              uVar30 = uVar30 - (0x8000U >> ((byte)uVar5 & 0x1f));
              psVar2 = (short *)((long)&s->arena + uVar17 * 2 + 0x6e2);
              *psVar2 = *psVar2 + 1;
              local_54 = uVar23;
            }
            uVar16 = uVar16 + 1;
            uVar27 = 0;
          }
          else {
            iVar11 = 0;
            uVar23 = 0;
            if (uVar5 == 0x10) {
              uVar23 = local_54;
            }
            uVar21 = uVar5 == 0x10 ^ 3;
            uVar22 = (uint)(uVar17 >> ((byte)uVar12 & 0x3f)) & kBitMask[uVar21];
            (s->br).bit_pos_ = uVar12 + uVar21;
            if ((uVar18 == uVar23) && (uVar23 = uVar18, uVar27 != 0)) {
              iVar11 = uVar27 - 2 << (sbyte)uVar21;
            }
            else {
              uVar27 = 0;
            }
            uVar12 = uVar22 + iVar11 + 3;
            iVar24 = uVar12 - uVar27;
            uVar21 = iVar24 + uVar16;
            if (alphabet_size_limit < uVar21) {
              uVar30 = 0xfffff;
              break;
            }
            if (uVar23 == 0) {
              uVar18 = 0;
              uVar16 = uVar21;
              uVar27 = uVar12;
            }
            else {
              uVar17 = (ulong)uVar23;
              iVar11 = ((iVar11 + uVar22) - uVar27) + 3;
              uVar27 = *(uint32_t *)((long)&s->arena + uVar17 * 4 + 0x650);
              do {
                uVar29 = uVar16;
                puVar28[(int)uVar27] = (uint16_t)uVar29;
                iVar11 = iVar11 + -1;
                uVar16 = uVar29 + 1;
                uVar27 = uVar29;
              } while (iVar11 != 0);
              *(uint32_t *)((long)&s->arena + uVar17 * 4 + 0x650) = uVar29;
              psVar2 = (short *)((long)&s->arena + uVar17 * 2 + 0x6e2);
              *psVar2 = *psVar2 + (short)iVar24;
              uVar30 = uVar30 - (iVar24 << (0xfU - (char)uVar23 & 0x1f));
              uVar16 = uVar21;
              uVar27 = uVar12;
              uVar18 = uVar23;
            }
          }
          if ((alphabet_size_limit <= uVar16) || (uVar30 == 0)) break;
        } while( true );
      }
      (s->arena).header.space = uVar30;
    }
    if (uVar30 != 0) {
      return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
    }
LAB_001405b5:
    uVar16 = BrotliBuildHuffmanTable(table,8,(s->arena).header.symbol_lists,count);
    if (opt_table_size != (uint32_t *)0x0) {
      *opt_table_size = uVar16;
    }
    goto LAB_001405d9;
  default:
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  uVar22 = alphabet_size_max - 1;
  uVar21 = 0x1f;
  if (uVar22 != 0) {
    for (; uVar22 >> uVar21 == 0; uVar21 = uVar21 - 1) {
    }
  }
  uVar21 = (uVar21 ^ 0xffffffe0) + 0x21;
  if (uVar22 == 0) {
    uVar21 = 0;
  }
  if (uVar23 <= uVar18) {
    uVar16 = (s->br).bit_pos_;
    do {
      uVar22 = 0x40 - uVar16;
      if (uVar22 < uVar21) {
        sVar26 = (s->br).avail_in;
        do {
          sVar26 = sVar26 - 1;
          if (sVar26 == 0xffffffffffffffff) {
            (s->arena).header.sub_loop_counter = uVar23;
            (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          uVar19 = (s->br).val_;
          pbVar6 = (s->br).next_in;
          (s->br).val_ = uVar19 >> 8;
          uVar25 = (ulong)*pbVar6 << 0x38 | uVar19 >> 8;
          (s->br).val_ = uVar25;
          uVar16 = uVar16 - 8;
          (s->br).bit_pos_ = uVar16;
          (s->br).avail_in = sVar26;
          (s->br).next_in = pbVar6 + 1;
          uVar22 = uVar22 + 8;
        } while (uVar22 < uVar21);
      }
      else {
        uVar25 = br->val_;
      }
      uVar22 = (uint)(uVar25 >> ((byte)uVar16 & 0x3f)) & kBitMask[uVar21];
      uVar16 = uVar16 + uVar21;
      (s->br).bit_pos_ = uVar16;
      if (alphabet_size_limit <= uVar22) {
        return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_ALPHABET;
      }
      *(short *)((long)&s->arena + (ulong)uVar23 * 2 + 0xb0) = (short)uVar22;
      uVar23 = uVar23 + 1;
    } while (uVar23 <= uVar18);
  }
  if (uVar18 == 0) {
    uVar18 = 0;
  }
  else {
    uVar19 = 0;
    do {
      lVar13 = uVar19 * 2;
      uVar19 = uVar19 + 1;
      uVar17 = uVar19 & 0xffffffff;
      do {
        if (*(short *)((long)&s->arena + lVar13 + 0xb0) ==
            *(short *)((long)&s->arena + uVar17 * 2 + 0xb0)) {
          return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME;
        }
        uVar23 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar23;
      } while (uVar23 <= uVar18);
    } while (uVar19 != uVar18);
LAB_0013fd7c:
    if (uVar18 == 3) {
      uVar18 = (s->br).bit_pos_;
      uVar19 = (ulong)uVar18;
      if (uVar18 == 0x40) {
        sVar26 = (s->br).avail_in;
        if (sVar26 == 0) {
          (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar19 = (s->br).val_;
        pbVar6 = (s->br).next_in;
        (s->br).val_ = uVar19 >> 8;
        uVar17 = (ulong)*pbVar6 << 0x38 | uVar19 >> 8;
        (s->br).val_ = uVar17;
        (s->br).avail_in = sVar26 - 1;
        (s->br).next_in = pbVar6 + 1;
        uVar19 = 0x38;
      }
      else {
        uVar17 = br->val_;
      }
      (s->br).bit_pos_ = (int)uVar19 + 1;
      uVar18 = ((uVar17 >> (uVar19 & 0x3f) & 1) != 0) + 3;
      (s->arena).header.symbol = uVar18;
    }
  }
  uVar16 = BrotliBuildSimpleHuffmanTable(table,8,(s->arena).header.symbols_lists_array,uVar18);
  if (opt_table_size != (uint32_t *)0x0) {
    *opt_table_size = uVar16;
  }
LAB_001405d9:
  (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
  return BROTLI_DECODER_SUCCESS;
}

Assistant:

static BrotliDecoderErrorCode ReadHuffmanCode(uint32_t alphabet_size_max,
                                              uint32_t alphabet_size_limit,
                                              HuffmanCode* table,
                                              uint32_t* opt_table_size,
                                              BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  BrotliMetablockHeaderArena* h = &s->arena.header;
  /* State machine. */
  for (;;) {
    switch (h->substate_huffman) {
      case BROTLI_STATE_HUFFMAN_NONE:
        if (!BrotliSafeReadBits(br, 2, &h->sub_loop_counter)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        BROTLI_LOG_UINT(h->sub_loop_counter);
        /* The value is used as follows:
           1 for simple code;
           0 for no skipping, 2 skips 2 code lengths, 3 skips 3 code lengths */
        if (h->sub_loop_counter != 1) {
          h->space = 32;
          h->repeat = 0;  /* num_codes */
          memset(&h->code_length_histo[0], 0, sizeof(h->code_length_histo[0]) *
              (BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1));
          memset(&h->code_length_code_lengths[0], 0,
              sizeof(h->code_length_code_lengths));
          h->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
          continue;
        }
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
        /* Read symbols, codes & code lengths directly. */
        if (!BrotliSafeReadBits(br, 2, &h->symbol)) {  /* num_symbols */
          h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        h->sub_loop_counter = 0;
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_SIMPLE_READ: {
        BrotliDecoderErrorCode result =
            ReadSimpleHuffmanSymbols(alphabet_size_max, alphabet_size_limit, s);
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }
      }
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD: {
        uint32_t table_size;
        if (h->symbol == 3) {
          uint32_t bits;
          if (!BrotliSafeReadBits(br, 1, &bits)) {
            h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          h->symbol += bits;
        }
        BROTLI_LOG_UINT(h->symbol);
        table_size = BrotliBuildSimpleHuffmanTable(
            table, HUFFMAN_TABLE_BITS, h->symbols_lists_array, h->symbol);
        if (opt_table_size) {
          *opt_table_size = table_size;
        }
        h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
        return BROTLI_DECODER_SUCCESS;
      }

      /* Decode Huffman-coded code lengths. */
      case BROTLI_STATE_HUFFMAN_COMPLEX: {
        uint32_t i;
        BrotliDecoderErrorCode result = ReadCodeLengthCodeLengths(s);
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }
        BrotliBuildCodeLengthsHuffmanTable(h->table,
                                           h->code_length_code_lengths,
                                           h->code_length_histo);
        memset(&h->code_length_histo[0], 0, sizeof(h->code_length_histo));
        for (i = 0; i <= BROTLI_HUFFMAN_MAX_CODE_LENGTH; ++i) {
          h->next_symbol[i] = (int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
          h->symbol_lists[h->next_symbol[i]] = 0xFFFF;
        }

        h->symbol = 0;
        h->prev_code_len = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
        h->repeat = 0;
        h->repeat_code_len = 0;
        h->space = 32768;
        h->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
      }
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS: {
        uint32_t table_size;
        BrotliDecoderErrorCode result = ReadSymbolCodeLengths(
            alphabet_size_limit, s);
        if (result == BROTLI_DECODER_NEEDS_MORE_INPUT) {
          result = SafeReadSymbolCodeLengths(alphabet_size_limit, s);
        }
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }

        if (h->space != 0) {
          BROTLI_LOG(("[ReadHuffmanCode] space = %d\n", (int)h->space));
          return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE);
        }
        table_size = BrotliBuildHuffmanTable(
            table, HUFFMAN_TABLE_BITS, h->symbol_lists, h->code_length_histo);
        if (opt_table_size) {
          *opt_table_size = table_size;
        }
        h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
        return BROTLI_DECODER_SUCCESS;
      }

      default:
        return
            BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
    }
  }
}